

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  Inst *inst0;
  uint32_t val;
  PatchList l;
  ulong uVar1;
  uint32_t val_00;
  
  val_00 = a.begin;
  val = b.begin;
  if (val == 0 || val_00 == 0) {
    b.begin = 0;
    b.end.p = 0;
    uVar1 = 0;
  }
  else {
    uVar1 = (ulong)b >> 0x20;
    inst0 = (this->inst_).ptr_._M_t.
            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
            super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    l = a.end.p;
    if ((inst0[(int)val_00].out_opcode_ & 0xfffffff7) == 6 && val_00 * 2 == l.p) {
      PatchList::Patch(inst0,l,val);
    }
    else if (this->reversed_ == true) {
      PatchList::Patch(inst0,b.end.p,val_00);
      uVar1 = (ulong)a >> 0x20;
    }
    else {
      PatchList::Patch(inst0,l,val);
      b = a;
    }
  }
  return (Frag)((ulong)b & 0xffffffff | uVar1 << 0x20);
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.p == (a.begin << 1) &&
      begin->out() == 0) {
    // in case refs to a somewhere
    PatchList::Patch(inst_.data(), a.end, b.begin);
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_.data(), b.end, a.begin);
    return Frag(b.begin, a.end);
  }

  PatchList::Patch(inst_.data(), a.end, b.begin);
  return Frag(a.begin, b.end);
}